

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlrole.c
# Opt level: O3

int error(PROLOG_STATE *state,int tok,char *ptr,char *end,ENCODING *enc)

{
  return 0;
}

Assistant:

static
int error(PROLOG_STATE *state,
          int tok,
          const char *ptr,
          const char *end,
          const ENCODING *enc)
{
  cmExpatUnused(state);
  cmExpatUnused(tok);
  cmExpatUnused(ptr);
  cmExpatUnused(end);
  cmExpatUnused(enc);
  return XML_ROLE_NONE;
}